

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

size_t Output::PrintBuffer(char16 *buf,size_t size)

{
  char *pcVar1;
  ulong *puVar2;
  undefined4 *puVar3;
  long *plVar4;
  code *pcVar5;
  bool bVar6;
  char16_t *pcVar7;
  size_t numCharsWantToWrite;
  char16_t *pcVar8;
  size_t numCharsWantToWrite_00;
  char16 *string;
  ulong uVar9;
  int iVar10;
  size_t sVar11;
  undefined8 *in_FS_OFFSET;
  undefined1 local_80 [8];
  anon_class_24_3_135c38f6 ensureSpace;
  char16 *local_48;
  size_t newbufsize;
  char16 *newbuf;
  
  if ((*(char *)*in_FS_OFFSET == '\x01') &&
     ((pcVar1 = (char *)*in_FS_OFFSET, *pcVar1 != '\x01' ||
      (pcVar7 = PAL_wcschr(buf,L'\n'), pcVar7 != (char16_t *)0x0)))) {
    puVar2 = (ulong *)*in_FS_OFFSET;
    local_48 = (char16 *)(*puVar2 + size);
    newbuf = (char16 *)calloc((size_t)local_48,2);
    newbufsize = (size_t)newbuf;
    if (newbuf == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)*in_FS_OFFSET;
      *puVar3 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                         ,0x12e,"(newbuf != nullptr)","Ran out of memory while printing output");
      if (!bVar6) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar3 = 0;
    }
    local_80 = (undefined1  [8])&newbuf;
    ensureSpace.currentWriteIndex = (char16 **)&newbufsize;
    ensureSpace.newbuf = &local_48;
    ensureSpace.newbufsize = (size_t *)*in_FS_OFFSET;
    numCharsWantToWrite = PAL_wcslen((char16_t *)*ensureSpace.newbufsize);
    uVar9 = *(ulong *)*in_FS_OFFSET;
    pcVar7 = buf + size;
    for (; buf < pcVar7; buf = buf + sVar11) {
      if (*pcVar1 == '\0') {
        sVar11 = (size_t)(uint)((int)*puVar2 - (int)uVar9);
        if (*puVar2 <= uVar9) {
          sVar11 = 1;
        }
        PrintBuffer::anon_class_24_3_135c38f6::operator()
                  ((anon_class_24_3_135c38f6 *)local_80,sVar11);
        while( true ) {
          iVar10 = (int)sVar11;
          sVar11 = (size_t)(iVar10 - 1);
          if (iVar10 == 0) break;
          *newbuf = L' ';
          newbuf = newbuf + 1;
        }
        PrintBuffer::anon_class_24_3_135c38f6::operator()
                  ((anon_class_24_3_135c38f6 *)local_80,numCharsWantToWrite);
        js_wmemcpy_s(newbuf,(long)(((long)local_48 * 2 + newbufsize) - (long)newbuf) >> 1,
                     (char16 *)*ensureSpace.newbufsize,numCharsWantToWrite);
        newbuf = newbuf + numCharsWantToWrite;
        uVar9 = *puVar2 + numCharsWantToWrite;
        *pcVar1 = '\x01';
      }
      pcVar8 = PAL_wcschr(buf,L'\n');
      if (pcVar8 == (char16_t *)0x0) {
        sVar11 = (long)pcVar7 - (long)buf >> 1;
        uVar9 = uVar9 + sVar11;
        numCharsWantToWrite_00 = -(long)buf >> 1;
      }
      else {
        numCharsWantToWrite_00 = (long)pcVar8 - (long)buf >> 1;
        sVar11 = numCharsWantToWrite_00 + 1;
        *pcVar1 = '\0';
        uVar9 = 0;
      }
      PrintBuffer::anon_class_24_3_135c38f6::operator()
                ((anon_class_24_3_135c38f6 *)local_80,numCharsWantToWrite_00);
      js_wmemcpy_s(newbuf,(long)(((long)local_48 * 2 + newbufsize) - (long)newbuf) >> 1,buf,sVar11);
      newbuf = newbuf + sVar11;
    }
    PrintBuffer::anon_class_24_3_135c38f6::operator()((anon_class_24_3_135c38f6 *)local_80,1);
    *newbuf = L'\0';
    size = ((long)((long)newbuf + (2 - newbufsize)) >> 1) - 1;
    buf = (char16 *)newbufsize;
  }
  plVar4 = (long *)*in_FS_OFFSET;
  *plVar4 = *plVar4 + size;
  string = buf;
  while (pcVar7 = PAL_wcschr(string,L'\n'), pcVar7 != (char16_t *)0x0) {
    *plVar4 = ~((long)pcVar7 - (long)buf >> 1) + size;
    string = pcVar7 + 1;
  }
  pcVar1 = (char *)*in_FS_OFFSET;
  if (*pcVar1 == '\0') {
    if (s_useDebuggerWindow == true) {
      OutputDebugStringW(buf);
      if (s_inMemoryLogger == (ILogger *)0x0) goto LAB_0021b929;
    }
    else if (s_inMemoryLogger == (ILogger *)0x0) goto LAB_0021b88c;
    (*(code *)**(undefined8 **)s_inMemoryLogger)(s_inMemoryLogger,buf);
  }
  else {
LAB_0021b88c:
    if ((*(PAL_FILE **)*in_FS_OFFSET == (PAL_FILE *)0x0) || (*pcVar1 == '\x01')) {
      DirectPrint(buf);
    }
    else {
      PAL_fwprintf(*(PAL_FILE **)*in_FS_OFFSET,L"%s",buf);
    }
    if ((s_outputFile.super_BasePtr<_PAL_FILE>.ptr != (_PAL_FILE *)0x0) && (*pcVar1 == '\0')) {
      PAL_fwprintf((PAL_FILE *)s_outputFile.super_BasePtr<_PAL_FILE>.ptr,L"%s",buf);
    }
  }
LAB_0021b929:
  Flush();
  return size;
}

Assistant:

size_t __cdecl
Output::PrintBuffer(const char16 * buf, size_t size)
{
    // Handle custom line prefixing
    bool internallyAllocatedBuffer = false;
    if (usingCustomAlignAndPrefix)
    {
        if (hasDoneAlignPrefixForThisLine && wcschr(buf, '\n') == nullptr)
        {
            // no newlines, and we've already prefixed this line, so nothing to do
        }
        else
        {
            size_t newbufsize = size + align;
            char16* newbuf = (char16*)calloc(newbufsize, sizeof(char16));
            AssertOrFailFastMsg(newbuf != nullptr, "Ran out of memory while printing output");
            internallyAllocatedBuffer = true;
            const char16* currentReadIndex = buf;
            char16* currentWriteIndex = newbuf;
            auto ensureSpace = [&currentWriteIndex, &newbuf, &newbufsize](size_t numCharsWantToWrite)
            {
                size_t charsWritten = (currentWriteIndex - newbuf); // pointer subtraction is number of elements of pointed type between pointers
                size_t remaining = newbufsize - charsWritten;
                if (numCharsWantToWrite + 1 > remaining)
                {
                    char16* tempbuf = (char16*)realloc(newbuf, newbufsize * sizeof(char16) * 2);
                    AssertOrFailFastMsg(tempbuf != nullptr, "Ran out of memory while printing output");
                    newbuf = tempbuf;
                    newbufsize = newbufsize * 2;
                    currentWriteIndex = newbuf + charsWritten;
                }
            };
            const size_t prefixlength = wcslen(prefix);
            size_t oldS_Column = Output::s_Column;
            while (currentReadIndex < buf + size)
            {
                if (!hasDoneAlignPrefixForThisLine)
                {
                    // attempt to write the alignment
                    {
                        unsigned int alignspacesneeded = 1; // always put at least one space
                        if (oldS_Column < align)
                        {
                            alignspacesneeded = (unsigned int)(align - oldS_Column);
                        }
                        ensureSpace(alignspacesneeded);
                        for (unsigned int i = 0; i < alignspacesneeded; i++)
                        {
                            *(currentWriteIndex++) = ' ';
                        }
                    }
                    // attempt to write the prefix
                    ensureSpace(prefixlength);
                    js_wmemcpy_s(currentWriteIndex, (newbuf + newbufsize) - currentWriteIndex, Output::prefix, prefixlength);
                    currentWriteIndex += prefixlength;
                    oldS_Column = align + prefixlength;
                    hasDoneAlignPrefixForThisLine = true;
                }
                const char16* endOfLine = wcschr(currentReadIndex, '\n');
                size_t charsToCopy = 0;
                if (endOfLine != nullptr)
                {
                    charsToCopy = (endOfLine - currentReadIndex) + 1; // We want to grab the newline character as part of this line
                    oldS_Column = 0; // We're ending this line, and want the next to be calculated properly
                    hasDoneAlignPrefixForThisLine = false; // The next line will need this
                }
                else
                {
                    charsToCopy = (buf + size) - currentReadIndex; // the rest of the input buffer
                    oldS_Column += charsToCopy; // Will be reset anyway later on
                }
                ensureSpace(endOfLine - currentReadIndex);
                js_wmemcpy_s(currentWriteIndex, (newbuf + newbufsize) - currentWriteIndex, currentReadIndex, charsToCopy);
                currentReadIndex += charsToCopy;
                currentWriteIndex += charsToCopy;
            }
            // null terminate becuase there's no real reason not to
            ensureSpace(1);
            *(currentWriteIndex++) = '\0';
            buf = newbuf;
            size = (currentWriteIndex - newbuf) - 1; // not counting the terminator here though, to align with vsnwprintf_s's behavior
        }
    }
    Output::s_Column += size;
    const char16 * endbuf = wcschr(buf, '\n');
    while (endbuf != nullptr)
    {
        Output::s_Column = size - (endbuf - buf) - 1;
        endbuf = wcschr(endbuf + 1, '\n');
    }

    bool useConsoleOrFile = true;
    if (!Output::s_capture)
    {
        if (Output::s_useDebuggerWindow)
        {
            OutputDebugStringW(buf);
            useConsoleOrFile = false;
        }
#ifdef ENABLE_TRACE
        if (Output::s_inMemoryLogger)
        {
            s_inMemoryLogger->Write(buf);
            useConsoleOrFile = false;
        }
#endif
    }

    if (useConsoleOrFile)
    {
        if (s_file == nullptr || Output::s_capture)
        {
#ifdef _WIN32
            bool addToBuffer = true;
            if (Output::bufferFreeSize < size + 1)
            {
                if (Output::bufferAllocSize > MAX_OUTPUT_BUFFER_SIZE && !Output::s_capture)
                {
                    Output::Flush();
                    if (Output::bufferFreeSize < size + 1)
                    {
                        DirectPrint(buf);
                        addToBuffer = false;
                    }
                }
                else
                {
                    size_t oldBufferSize = bufferAllocSize - bufferFreeSize;
                    size_t newBufferAllocSize = (bufferAllocSize + size + 1) * 4 / 3;
                    char16 * newBuffer = (char16 *)realloc(buffer, (newBufferAllocSize * sizeof(char16)));
                    if (newBuffer == nullptr)
                    {
                        // See if I can just flush it and print directly
                        Output::Flush();

                        // Reset the buffer
                        free(Output::buffer);
                        Output::buffer = nullptr;
                        Output::bufferAllocSize = 0;
                        Output::bufferFreeSize = 0;

                        // Print it directly
                        DirectPrint(buf);
                        addToBuffer = false;
                    }
                    else
                    {
                        bufferAllocSize = newBufferAllocSize;
                        buffer = newBuffer;
                        bufferFreeSize = bufferAllocSize - oldBufferSize;
                    }
                }
            }
            if (addToBuffer)
            {
                Assert(Output::bufferFreeSize >= size + 1);
                memcpy_s(Output::buffer + Output::bufferAllocSize - Output::bufferFreeSize, Output::bufferFreeSize * sizeof(char16),
                    buf, size * sizeof(char16));
                bufferFreeSize -= size;
                Output::buffer[Output::bufferAllocSize - Output::bufferFreeSize] = _u('\0');  // null terminate explicitly
            }
#else
            DirectPrint(buf);
#endif
        }
        else
        {
            fwprintf_s(Output::s_file, _u("%s"), buf);
        }

        if(s_outputFile != nullptr && !Output::s_capture)
        {
            fwprintf_s(s_outputFile, _u("%s"), buf);
        }
    }

    Output::Flush();

    return size;
}